

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *in_RDX;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  ImmutableExtensionGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  UnderscoresToCamelCase_abi_cxx11_(&local_38,(java *)this->descriptor_,in_RDX);
  io::Printer::Print(printer,"registry.add($scope$.$name$);\n","scope",&this->scope_,"name",
                     &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print(
    "registry.add($scope$.$name$);\n",
    "scope", scope_,
    "name", UnderscoresToCamelCase(descriptor_));
  return 7;
}